

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry_retriever.cpp
# Opt level: O2

LogicalType * __thiscall
duckdb::CatalogEntryRetriever::GetType
          (LogicalType *__return_storage_ptr__,CatalogEntryRetriever *this,string *catalog,
          string *schema,string *name,OnEntryNotFound on_entry_not_found)

{
  CatalogEntry *pCVar1;
  optional_ptr<duckdb::CatalogEntry,_true> result;
  EntryLookupInfo lookup_info;
  
  EntryLookupInfo::EntryLookupInfo
            (&lookup_info,TYPE_ENTRY,name,(QueryErrorContext)0xffffffffffffffff);
  result = GetEntry(this,catalog,schema,&lookup_info,on_entry_not_found);
  if (result.ptr == (CatalogEntry *)0x0) {
    LogicalType::LogicalType(__return_storage_ptr__,INVALID);
  }
  else {
    pCVar1 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&result);
    LogicalType::LogicalType(__return_storage_ptr__,(LogicalType *)&pCVar1[1].timestamp);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType CatalogEntryRetriever::GetType(const string &catalog, const string &schema, const string &name,
                                           OnEntryNotFound on_entry_not_found) {
	EntryLookupInfo lookup_info(CatalogType::TYPE_ENTRY, name);
	auto result = GetEntry(catalog, schema, lookup_info, on_entry_not_found);
	if (!result) {
		return LogicalType::INVALID;
	}
	auto &type_entry = result->Cast<TypeCatalogEntry>();
	return type_entry.user_type;
}